

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O2

bool __thiscall
google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare::operator()
          (FileCompare *this,string_view a,FileEntry *b)

{
  bool bVar1;
  basic_string_view<char,_std::char_traits<char>_> __y;
  
  __y._M_str = (b->encoded_name)._M_dataplus._M_p;
  __y._M_len = (b->encoded_name)._M_string_length;
  bVar1 = std::operator<(a,__y);
  return bVar1;
}

Assistant:

bool operator()(absl::string_view a, const FileEntry& b) const {
      return a < b.name(index);
    }